

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ExpressionBinder::QualifyColumnName
          (ExpressionBinder *this,ColumnRefExpression *col_ref,ErrorData *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  ErrorData *pEVar4;
  reference table_name;
  reference column_name;
  Binding *pBVar5;
  string *psVar6;
  ErrorData *in_RCX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *base;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  optional_ptr<duckdb::Binding,_true> binding;
  ErrorData other_error;
  
  bVar2 = ColumnRefExpression::IsQualified((ColumnRefExpression *)error);
  if (!bVar2) {
    (**(code **)(*(long *)error + 0x38))(&other_error,error);
    LambdaRefExpression::FindMatchingBinding
              ((LambdaRefExpression *)this,
               (optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *)
               ((long)&(col_ref->super_ParsedExpression).super_BaseExpression.alias.field_2 + 8),
               (string *)&other_error);
    ::std::__cxx11::string::~string((string *)&other_error);
    if (this->_vptr_ExpressionBinder != (_func_int **)0x0) {
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             this;
    }
    ::std::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)this);
  }
  lVar3 = (long)(*(long *)((long)&(error->final_message).field_2 + 8) -
                (error->final_message).field_2._M_allocated_capacity) >> 5;
  if (lVar3 == 2) {
    this_00 = &(error->final_message).field_2;
    local_c0 = (undefined1  [8])
               (col_ref->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    table_name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)this_00,0);
    column_name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)this_00,1);
    binding = Binder::GetMatchingBinding((Binder *)local_c0,table_name,column_name,in_RCX);
    if (binding.ptr == (Binding *)0x0) {
      ErrorData::ErrorData(&other_error);
      pEVar4 = (ErrorData *)
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)this_00,0);
      QualifyColumnName((ExpressionBinder *)(local_d0 + 8),(string *)col_ref,pEVar4);
      if ((long *)local_d0._8_8_ == (long *)0x0) {
        CreateStructPack(this,col_ref);
      }
      else {
        local_d0._0_8_ = local_d0._8_8_;
        local_d0._8_8_ = (long *)0x0;
        base = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)0x1;
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     *)this_00,1);
        CreateStructExtract(this,base,(string *)local_d0);
        if ((long *)local_d0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_d0._0_8_ + 8))();
        }
        local_d0._0_8_ = (pointer)0x0;
      }
      if ((long *)local_d0._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_d0._8_8_ + 8))();
      }
      ErrorData::~ErrorData(&other_error);
    }
    else {
      pbVar1 = (col_ref->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar5 = optional_ptr<duckdb::Binding,_true>::operator->(&binding);
      psVar6 = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)error);
      BindContext::CreateColumnReference
                ((BindContext *)this,(BindingAlias *)&pbVar1[4]._M_string_length,
                 &(pBVar5->alias).catalog,(ColumnBindType)psVar6);
    }
  }
  else if (lVar3 == 1) {
    pEVar4 = (ErrorData *)
             ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)error);
    QualifyColumnName((ExpressionBinder *)&other_error,(string *)col_ref,pEVar4);
    if (other_error._0_8_ == 0) {
      CreateStructPack(this,col_ref);
      if (other_error._0_8_ != 0) {
        (**(code **)(*(long *)other_error._0_8_ + 8))();
      }
    }
    else {
      this->_vptr_ExpressionBinder = (_func_int **)other_error._0_8_;
    }
  }
  else {
    QualifyColumnNameWithManyDots(this,col_ref,error);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ExpressionBinder::QualifyColumnName(ColumnRefExpression &col_ref, ErrorData &error) {

	// try binding as a lambda parameter
	if (!col_ref.IsQualified()) {
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, col_ref.GetName());
		if (lambda_ref) {
			return lambda_ref;
		}
	}

	idx_t column_parts = col_ref.column_names.size();

	// column names can have an arbitrary amount of dots
	// here is how the resolution works:
	if (column_parts == 1) {
		// no dots (i.e. "part1")
		// -> part1 refers to a column
		// check if we can qualify the column name with the table name
		auto qualified_col_ref = QualifyColumnName(col_ref.GetColumnName(), error);
		if (qualified_col_ref) {
			// we could: return it
			return qualified_col_ref;
		}
		// we could not! Try creating an implicit struct_pack
		return CreateStructPack(col_ref);
	}

	if (column_parts == 2) {
		// one dot (i.e. "part1.part2")
		// EITHER:
		// -> part1 is a table, part2 is a column
		// -> part1 is a column, part2 is a property of that column (i.e. struct_extract)

		// first check if part1 is a table, and part2 is a standard column name
		auto binding = binder.GetMatchingBinding(col_ref.column_names[0], col_ref.column_names[1], error);
		if (binding) {
			// it is! return the column reference directly
			return binder.bind_context.CreateColumnReference(binding->alias, col_ref.GetColumnName());
		}

		// otherwise check if we can turn this into a struct extract
		ErrorData other_error;
		auto qualified_col_ref = QualifyColumnName(col_ref.column_names[0], other_error);
		if (qualified_col_ref) {
			// we could: create a struct extract
			return CreateStructExtract(std::move(qualified_col_ref), col_ref.column_names[1]);
		}
		// we could not! Try creating an implicit struct_pack
		return CreateStructPack(col_ref);
	}

	// three or more dots
	return QualifyColumnNameWithManyDots(col_ref, error);
}